

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall cab_provision_complex4::test_method(cab_provision_complex4 *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  unit_test_log_t *this_01;
  bool bVar1;
  element_type *peVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_190;
  undefined4 local_170;
  id_type local_16c;
  undefined1 local_165 [5];
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
  local_160;
  assertion_result local_158;
  basic_cstring<const_char> local_140;
  basic_cstring<const_char> local_130;
  undefined1 local_120 [16];
  undefined1 local_110 [8];
  shared_ptr<cab> c;
  undefined1 local_f8 [6];
  node_type dst;
  node_type src;
  weak_ptr<cab_session> local_d8;
  undefined1 local_c8 [8];
  shared_ptr<cab_session> session;
  cab_manager manager;
  cab_provision_complex4 *this_local;
  
  this_00 = &session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  cab_manager::cab_manager((cab_manager *)this_00);
  std::shared_ptr<cab_session>::shared_ptr((shared_ptr<cab_session> *)local_c8,(nullptr_t)0x0);
  std::weak_ptr<cab_session>::weak_ptr<cab_session,void>
            (&local_d8,(shared_ptr<cab_session> *)local_c8);
  cab_manager::create((cab_manager *)this_00,&local_d8);
  std::weak_ptr<cab_session>::~weak_ptr(&local_d8);
  std::weak_ptr<cab_session>::weak_ptr<cab_session,void>
            ((weak_ptr<cab_session> *)local_f8,(shared_ptr<cab_session> *)local_c8);
  cab_manager::create((cab_manager *)
                      &session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(weak_ptr<cab_session> *)local_f8);
  std::weak_ptr<cab_session>::~weak_ptr((weak_ptr<cab_session> *)local_f8);
  c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = P1;
  c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = P3;
  cab_manager::find_cab((cab_manager *)local_110,(char)&session + P3,P1,8);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_110);
  cab::add_request(peVar2,c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                          _7_1_,
                   c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_,4);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_110);
  cab::update_position(peVar2,P0);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_110);
  cab::update_position(peVar2,I1);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_110);
  cab::update_position(peVar2,P1);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_110);
  cab::update_position(peVar2,I2);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_110);
  cab::update_position(peVar2,I3);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_110);
  cab::update_position(peVar2,P3);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_110);
  cab::update_position(peVar2,I4);
  c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 2;
  c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 8;
  cab_manager::find_cab((cab_manager *)local_120,(char)&session + P3,P0,8);
  std::shared_ptr<cab>::operator=((shared_ptr<cab> *)local_110,(shared_ptr<cab> *)local_120);
  std::shared_ptr<cab>::~shared_ptr((shared_ptr<cab> *)local_120);
  do {
    this_01 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_140);
    boost::unit_test::unit_test_log_t::set_checkpoint(this_01,&local_130,0x18e,&local_140);
    peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_110);
    local_16c = cab::id(peVar2);
    boost::test_tools::assertion::seed::operator->*((seed *)(local_165 + 1),(uint *)local_165);
    local_170 = 0;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>::operator==
              ((expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>
                *)&local_160,(int *)(local_165 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
    ::evaluate(&local_158,&local_160,false);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,"c->id() == 0",0xc);
    boost::unit_test::operator<<(&local_190,prev,&local_1a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion
              (&local_158,&local_190.super_lazy_ostream,&local_1b0,0x18e,CHECK,CHECK_BUILT_ASSERTION
               ,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_190);
    boost::test_tools::assertion_result::~assertion_result(&local_158);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::shared_ptr<cab>::~shared_ptr((shared_ptr<cab> *)local_110);
  std::shared_ptr<cab_session>::~shared_ptr((shared_ptr<cab_session> *)local_c8);
  cab_manager::~cab_manager
            ((cab_manager *)
             &session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(cab_provision_complex4)
{
    cab_manager manager;
    std::shared_ptr<cab_session> session = nullptr;
    
    manager.create(session);
    manager.create(session);

    node_type src = node_type::P1;
    node_type dst = node_type::P3;

    std::shared_ptr<cab> c = manager.find_cab(src, dst, 4);
    c->add_request(src, dst, 4);

    c->update_position(node_type::P0);
    c->update_position(node_type::I1);
    c->update_position(node_type::P1);
    c->update_position(node_type::I2);
    c->update_position(node_type::I3);
    c->update_position(node_type::P3);
    c->update_position(node_type::I4);

    src = node_type::P0;
    dst = node_type::P3;  

    c = manager.find_cab(src, dst, 1);

    BOOST_TEST(c->id() == 0);
}